

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_65b9::FlexFloatConversionTest_LowersPrecision_Test::TestBody
          (FlexFloatConversionTest_LowersPrecision_Test *this)

{
  char *message;
  double val;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  flexfloat_t local_28;
  double local_18;
  
  local_18 = 1.000000000000001;
  local_28.value = 1.000000000000001;
  local_28.desc.exp_bits = '\b';
  local_28.desc.frac_bits = '\x17';
  flexfloat_sanitize(&local_28);
  local_40.data_ = (AssertHelperData *)local_28.value;
  testing::internal::CmpHelperNE<double,double>
            (local_38,"val","double(flexfloat<8, 23>(val))",&local_18,(double *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/conversion.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((AssertHelperData *)local_28.value != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_28.value + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST(FlexFloatConversionTest, LowersPrecision) {
    const double val = 1.0 + 1e-15;
    EXPECT_NE(val, double(flexfloat<8, 23>(val)));  // round to float
}